

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O2

int Gia_ManSatokoCallOne(Gia_Man_t *p,satoko_opts_t *opts,int iOutput)

{
  int status;
  abctime aVar1;
  satoko_t *s;
  satoko_stats_t *psVar2;
  abctime aVar3;
  int iVar4;
  
  aVar1 = Abc_Clock();
  s = Gia_ManSatokoCreate(p,opts);
  if (s == (satoko_t *)0x0) {
    iVar4 = 0;
    status = -1;
  }
  else {
    status = satoko_solve(s);
    psVar2 = satoko_stats(s);
    iVar4 = (int)psVar2->n_conflicts;
    satoko_destroy(s);
  }
  aVar3 = Abc_Clock();
  Gia_ManSatokoReport(iOutput,status,aVar3 - aVar1);
  return iVar4;
}

Assistant:

int Gia_ManSatokoCallOne( Gia_Man_t * p, satoko_opts_t * opts, int iOutput )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat;
    int status = SATOKO_UNSAT, Cost = 0;
    pSat = Gia_ManSatokoCreate( p, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        Cost = satoko_stats(pSat)->n_conflicts;
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( iOutput, status, Abc_Clock() - clk );
    return Cost;
}